

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O0

int Of_SetLastCutIsContained(Of_Cut_t **pCuts,int nCuts)

{
  int iVar1;
  int local_20;
  int i;
  int nCuts_local;
  Of_Cut_t **pCuts_local;
  
  local_20 = 0;
  while( true ) {
    if (nCuts <= local_20) {
      return 0;
    }
    if (((*(uint *)&pCuts[local_20]->field_0x10 >> 0x1b <=
          *(uint *)&pCuts[nCuts]->field_0x10 >> 0x1b) &&
        ((pCuts[local_20]->Sign & pCuts[nCuts]->Sign) == pCuts[local_20]->Sign)) &&
       (iVar1 = Of_SetCutIsContainedOrder(pCuts[nCuts],pCuts[local_20]), iVar1 != 0)) break;
    local_20 = local_20 + 1;
  }
  return 1;
}

Assistant:

static inline int Of_SetLastCutIsContained( Of_Cut_t ** pCuts, int nCuts )
{
    int i;
    for ( i = 0; i < nCuts; i++ )
        if ( pCuts[i]->nLeaves <= pCuts[nCuts]->nLeaves && (pCuts[i]->Sign & pCuts[nCuts]->Sign) == pCuts[i]->Sign && Of_SetCutIsContainedOrder(pCuts[nCuts], pCuts[i]) )
            return 1;
    return 0;
}